

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_decoder.cpp
# Opt level: O2

AbbrevDesc * __thiscall
LLVMBC::BitcodeReader::getAbbrev(BitcodeReader *this,uint32_t blockId,uint32_t abbrevID)

{
  mapped_type pBVar1;
  pointer ppBVar2;
  BlockContext *pBVar3;
  mapped_type *ppBVar4;
  ulong uVar5;
  pointer pAVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t blockId_local;
  
  ppBVar4 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_LLVMBC::BlockInfo_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_LLVMBC::BlockInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_LLVMBC::BlockInfo_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_LLVMBC::BlockInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->blockInfo,&blockId_local);
  if (abbrevID < 4) {
    __assert_fail("abbrevID >= APPLICATION_ABBREV",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                  ,0x13a,"const AbbrevDesc &LLVMBC::BitcodeReader::getAbbrev(uint32_t, uint32_t)");
  }
  pBVar1 = *ppBVar4;
  uVar7 = abbrevID - 4;
  if (pBVar1 != (mapped_type)0x0) {
    uVar8 = (ulong)uVar7;
    pAVar6 = (pBVar1->abbrevs).
             super__Vector_base<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(pBVar1->abbrevs).
                   super__Vector_base<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) / 0x18;
    if (uVar8 < uVar5) goto LAB_00180cf0;
    uVar7 = uVar7 - (int)uVar5;
  }
  ppBVar2 = (this->blockStack).
            super__Vector_base<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->blockStack).
      super__Vector_base<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppBVar2) {
    __assert_fail("!blockStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                  ,0x147,"const AbbrevDesc &LLVMBC::BitcodeReader::getAbbrev(uint32_t, uint32_t)");
  }
  uVar8 = (ulong)uVar7;
  pBVar3 = ppBVar2[-1];
  pAVar6 = (pBVar3->abbrevs).
           super__Vector_base<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(pBVar3->abbrevs).
                     super__Vector_base<LLVMBC::AbbrevDesc,_dxil_spv::ThreadLocalAllocator<LLVMBC::AbbrevDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) / 0x18) <= uVar8) {
    __assert_fail("abbrevID < blockStack.back()->abbrevs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                  ,0x148,"const AbbrevDesc &LLVMBC::BitcodeReader::getAbbrev(uint32_t, uint32_t)");
  }
LAB_00180cf0:
  return pAVar6 + uVar8;
}

Assistant:

const AbbrevDesc &BitcodeReader::getAbbrev(uint32_t blockId, uint32_t abbrevID)
{
  const BlockInfo *info = blockInfo[blockId];

  // IDs start at the first application specified ID. Rebase to that to get 0-base indices
  assert(abbrevID >= APPLICATION_ABBREV);
  abbrevID -= APPLICATION_ABBREV;

  if(info)
  {
    // IDs are first assigned to those permanently from BLOCKINFO
    if(abbrevID < info->abbrevs.size())
      return info->abbrevs[abbrevID];

    // block-local IDs start after the BLOCKINFO ones
    abbrevID -= (uint32_t)info->abbrevs.size();
  }

  assert(!blockStack.empty());
  assert(abbrevID < blockStack.back()->abbrevs.size());

  return blockStack.back()->abbrevs[abbrevID];
}